

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::
BlockImpl_dense<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>,_1,_-1,_true,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_1,__1,_true,_true>
                  *this,Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>
                        *xpr,Index i)

{
  Scalar *pSVar1;
  Index IVar2;
  Index cols;
  EVP_PKEY_CTX *ctx;
  Index i_local;
  Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>
  *xpr_local;
  BlockImpl_dense<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_1,__1,_true,_true>
  *this_local;
  
  pSVar1 = MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>,_0>
           ::data((MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
                   *)xpr);
  IVar2 = BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true,_true>
          ::outerStride((BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
                         *)xpr);
  cols = MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>,_0>
         ::cols((MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
                 *)xpr);
  MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>,_1,_-1,_true>,_0>
  ::MapBase(&this->
             super_MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_1,__1,_true>,_0>
            ,pSVar1 + i * IVar2,1,cols);
  memcpy(&this->m_xpr,xpr,0x38);
  variable_if_dynamic<long,_0>::variable_if_dynamic
            ((variable_if_dynamic<long,_0> *)&this->field_0x50,i);
  ctx = (EVP_PKEY_CTX *)0x0;
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startCol,0);
  init(this,ctx);
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr, Index i)
      : Base(xpr.data() + i * (    ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && (!XprTypeIsRowMajor))
                                || ((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && ( XprTypeIsRowMajor)) ? xpr.innerStride() : xpr.outerStride()),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr),
        m_startRow( (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0),
        m_startCol( (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)
    {
      init();
    }